

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::setEncryptionParametersInternal
          (QPDFWriter *this,int V,int R,int key_len,int P,string *O,string *U,string *OE,string *UE,
          string *Perms,string *id1,string *user_password,string *encryption_key)

{
  string *O_00;
  int iVar1;
  uint Length_bytes;
  int R_00;
  int V_00;
  element_type *peVar2;
  mapped_type *pmVar3;
  EncryptionData *data;
  char *local_978;
  char *local_960;
  char *local_958;
  char *local_8e8;
  string local_770;
  undefined1 local_750 [8];
  EncryptionData encryption_data;
  key_type local_670;
  allocator<char> local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  allocator<char> local_5a1;
  undefined1 local_5a0 [8];
  string method;
  key_type local_578;
  allocator<char> local_551;
  key_type local_550;
  allocator<char> local_529;
  key_type local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  key_type local_438;
  string local_418;
  QPDF_String local_3f8;
  string local_3d8;
  allocator<char> local_3b1;
  key_type local_3b0;
  string local_390;
  QPDF_String local_370;
  string local_350;
  allocator<char> local_329;
  key_type local_328;
  string local_308;
  QPDF_String local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  key_type local_2a0;
  string local_280;
  QPDF_String local_260;
  string local_240;
  allocator<char> local_219;
  key_type local_218;
  string local_1f8;
  QPDF_String local_1d8;
  string local_1b8;
  allocator<char> local_191;
  key_type local_190;
  string local_170;
  allocator<char> local_149;
  key_type local_148;
  string local_128;
  allocator<char> local_101;
  key_type local_100;
  string local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  allocator<char> local_61;
  key_type local_60;
  string *local_40;
  string *O_local;
  int P_local;
  int key_len_local;
  int R_local;
  int V_local;
  QPDFWriter *this_local;
  
  local_40 = O;
  O_local._0_4_ = P;
  O_local._4_4_ = key_len;
  P_local = R;
  key_len_local = V;
  _R_local = this;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar1 = P_local;
  peVar2->encryption_V = V;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2->encryption_R = iVar1;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/Filter",&local_61);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_60);
  std::__cxx11::string::operator=((string *)pmVar3,"/Standard");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::to_string(&local_98,key_len_local);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/V",&local_b9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::to_string(&local_e0,O_local._4_4_ << 3);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"/Length",&local_101);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_100);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::to_string(&local_128,P_local);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"/R",&local_149);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_148);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::to_string(&local_170,(int)O_local);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"/P",&local_191);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_190);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_1f8,(string *)local_40);
  QPDF_String::QPDF_String(&local_1d8,&local_1f8);
  QPDF_String::unparse_abi_cxx11_(&local_1b8,&local_1d8,true);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"/O",&local_219);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_218);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1b8);
  QPDF_String::~QPDF_String(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::string((string *)&local_280,(string *)U);
  QPDF_String::QPDF_String(&local_260,&local_280);
  QPDF_String::unparse_abi_cxx11_(&local_240,&local_260,true);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"/U",&local_2a1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar2->encryption_dictionary,&local_2a0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_240);
  QPDF_String::~QPDF_String(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  if (4 < key_len_local) {
    std::__cxx11::string::string((string *)&local_308,(string *)OE);
    QPDF_String::QPDF_String(&local_2e8,&local_308);
    QPDF_String::unparse_abi_cxx11_(&local_2c8,&local_2e8,true);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"/OE",&local_329);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_328);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    std::__cxx11::string::~string((string *)&local_2c8);
    QPDF_String::~QPDF_String(&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::string((string *)&local_390,(string *)UE);
    QPDF_String::QPDF_String(&local_370,&local_390);
    QPDF_String::unparse_abi_cxx11_(&local_350,&local_370,true);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"/UE",&local_3b1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_3b0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::__cxx11::string::~string((string *)&local_350);
    QPDF_String::~QPDF_String(&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string((string *)&local_418,(string *)Perms);
    QPDF_String::QPDF_String(&local_3f8,&local_418);
    QPDF_String::unparse_abi_cxx11_(&local_3d8,&local_3f8,true);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"/Perms",&local_439);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_438);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::__cxx11::string::~string((string *)&local_3d8);
    QPDF_String::~QPDF_String(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
  }
  if (P_local < 6) {
    if (P_local == 5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"1.7",&local_489);
      setMinimumPDFVersion(this,&local_488,3);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
    }
    else if (P_local == 4) {
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar2->encrypt_use_aes & 1U) == 0) {
        local_8e8 = "1.5";
      }
      else {
        local_8e8 = "1.6";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,local_8e8,&local_4b1);
      setMinimumPDFVersion(this,&local_4b0,0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
    }
    else if (P_local == 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"1.4",&local_4d9);
      setMinimumPDFVersion(this,&local_4d8,0);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator(&local_4d9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"1.3",&local_501);
      setMinimumPDFVersion(this,&local_500,0);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"1.7",&local_461);
    setMinimumPDFVersion(this,&local_460,8);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
  }
  if ((3 < P_local) &&
     (peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this), (peVar2->encrypt_metadata & 1U) == 0)) {
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"/EncryptMetadata",&local_529);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_528);
    std::__cxx11::string::operator=((string *)pmVar3,"false");
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator(&local_529);
  }
  if ((key_len_local == 4) || (key_len_local == 5)) {
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"/StmF",&local_551);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_550);
    std::__cxx11::string::operator=((string *)pmVar3,"/StdCF");
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator(&local_551);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_578,"/StrF",(allocator<char> *)(method.field_2._M_local_buf + 0xf));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_578);
    std::__cxx11::string::operator=((string *)pmVar3,"/StdCF");
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)(method.field_2._M_local_buf + 0xf));
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar2->encrypt_use_aes & 1U) == 0) {
      local_960 = "/V2";
    }
    else {
      if (key_len_local < 5) {
        local_958 = "/AESV2";
      }
      else {
        local_958 = "/AESV3";
      }
      local_960 = local_958;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5a0,local_960,&local_5a1);
    std::allocator<char>::~allocator(&local_5a1);
    std::operator+(&local_628,"<< /StdCF << /AuthEvent /DocOpen /CFM ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0);
    std::operator+(&local_608,&local_628," /Length ");
    if (key_len_local < 5) {
      local_978 = "16";
    }
    else {
      local_978 = "32";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,local_978,&local_649);
    std::operator+(&local_5e8,&local_608,&local_648);
    std::operator+(&local_5c8,&local_5e8," >> >>");
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"/CF",(allocator<char> *)&encryption_data.field_0xd7);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar2->encryption_dictionary,&local_670);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator((allocator<char> *)&encryption_data.field_0xd7);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)local_5a0);
  }
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  V_00 = key_len_local;
  R_00 = P_local;
  Length_bytes = O_local._4_4_;
  iVar1 = (int)O_local;
  O_00 = local_40;
  peVar2->encrypted = true;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  data = (EncryptionData *)(ulong)Length_bytes;
  QPDF::EncryptionData::EncryptionData
            ((EncryptionData *)local_750,V_00,R_00,Length_bytes,iVar1,O_00,U,OE,UE,Perms,id1,
             (bool)(peVar2->encrypt_metadata & 1));
  if (key_len_local < 5) {
    QPDF::compute_encryption_key(&local_770,(QPDF *)user_password,(string *)local_750,data);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=((string *)&peVar2->encryption_key,(string *)&local_770);
    std::__cxx11::string::~string((string *)&local_770);
  }
  else {
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=((string *)&peVar2->encryption_key,(string *)encryption_key);
  }
  QPDF::EncryptionData::~EncryptionData((EncryptionData *)local_750);
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParametersInternal(
    int V,
    int R,
    int key_len,
    int P,
    std::string const& O,
    std::string const& U,
    std::string const& OE,
    std::string const& UE,
    std::string const& Perms,
    std::string const& id1,
    std::string const& user_password,
    std::string const& encryption_key)
{
    m->encryption_V = V;
    m->encryption_R = R;
    m->encryption_dictionary["/Filter"] = "/Standard";
    m->encryption_dictionary["/V"] = std::to_string(V);
    m->encryption_dictionary["/Length"] = std::to_string(key_len * 8);
    m->encryption_dictionary["/R"] = std::to_string(R);
    m->encryption_dictionary["/P"] = std::to_string(P);
    m->encryption_dictionary["/O"] = QPDF_String(O).unparse(true);
    m->encryption_dictionary["/U"] = QPDF_String(U).unparse(true);
    if (V >= 5) {
        m->encryption_dictionary["/OE"] = QPDF_String(OE).unparse(true);
        m->encryption_dictionary["/UE"] = QPDF_String(UE).unparse(true);
        m->encryption_dictionary["/Perms"] = QPDF_String(Perms).unparse(true);
    }
    if (R >= 6) {
        setMinimumPDFVersion("1.7", 8);
    } else if (R == 5) {
        setMinimumPDFVersion("1.7", 3);
    } else if (R == 4) {
        setMinimumPDFVersion(m->encrypt_use_aes ? "1.6" : "1.5");
    } else if (R == 3) {
        setMinimumPDFVersion("1.4");
    } else {
        setMinimumPDFVersion("1.3");
    }

    if ((R >= 4) && (!m->encrypt_metadata)) {
        m->encryption_dictionary["/EncryptMetadata"] = "false";
    }
    if ((V == 4) || (V == 5)) {
        // The spec says the value for the crypt filter key can be anything, and xpdf seems to
        // agree.  However, Adobe Reader won't open our files unless we use /StdCF.
        m->encryption_dictionary["/StmF"] = "/StdCF";
        m->encryption_dictionary["/StrF"] = "/StdCF";
        std::string method = (m->encrypt_use_aes ? ((V < 5) ? "/AESV2" : "/AESV3") : "/V2");
        // The PDF spec says the /Length key is optional, but the PDF previewer on some versions of
        // MacOS won't open encrypted files without it.
        m->encryption_dictionary["/CF"] = "<< /StdCF << /AuthEvent /DocOpen /CFM " + method +
            " /Length " + std::string((V < 5) ? "16" : "32") + " >> >>";
    }

    m->encrypted = true;
    QPDF::EncryptionData encryption_data(
        V, R, key_len, P, O, U, OE, UE, Perms, id1, m->encrypt_metadata);
    if (V < 5) {
        m->encryption_key = QPDF::compute_encryption_key(user_password, encryption_data);
    } else {
        m->encryption_key = encryption_key;
    }
}